

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdflogger-c.cc
# Opt level: O1

void qpdflogger_set_save(qpdflogger_handle l,qpdf_log_dest_e dest,qpdf_log_fn_t fn,void *udata,
                        int only_if_not_set)

{
  QPDFLogger *l_00;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  l_00 = (l->l).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x20);
  *(code **)local_58._M_unused._0_8_ = QPDFLogger::setSave;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(int *)((long)local_58._M_unused._0_8_ + 0x10) = only_if_not_set;
  *(QPDFLogger **)((long)local_58._M_unused._0_8_ + 0x18) = l_00;
  pcStack_40 = std::
               _Function_handler<void_(std::shared_ptr<Pipeline>),_std::_Bind<std::_Mem_fn<void_(QPDFLogger::*)(std::shared_ptr<Pipeline>,_bool)>_(QPDFLogger_*,_std::_Placeholder<1>,_int)>_>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(std::shared_ptr<Pipeline>),_std::_Bind<std::_Mem_fn<void_(QPDFLogger::*)(std::shared_ptr<Pipeline>,_bool)>_(QPDFLogger_*,_std::_Placeholder<1>,_int)>_>
             ::_M_manager;
  set_log_dest(l_00,(function<void_(std::shared_ptr<Pipeline>)> *)&local_58,dest,"save logger",fn,
               udata);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return;
}

Assistant:

void
qpdflogger_set_save(
    qpdflogger_handle l, qpdf_log_dest_e dest, qpdf_log_fn_t fn, void* udata, int only_if_not_set)
{
    auto method = std::bind(
        std::mem_fn(&QPDFLogger::setSave), l->l.get(), std::placeholders::_1, only_if_not_set);
    set_log_dest(l->l.get(), method, dest, "save logger", fn, udata);
}